

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void __thiscall
Assimp::IFC::TempMesh::ComputePolygonNormals
          (TempMesh *this,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *normals,
          bool normalize,size_t ofs)

{
  pointer *ppaVar1;
  uint *puVar2;
  iterator iVar3;
  pointer paVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  size_type __n;
  uint *puVar12;
  IfcVector3 *n;
  pointer paVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<double,_std::allocator<double>_> temp;
  vector<double,_std::allocator<double>_> local_60;
  aiVector3t<double> local_48;
  
  puVar12 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start + ofs;
  puVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar12 == puVar2) {
    __n = 8;
  }
  else {
    uVar11 = 0;
    puVar5 = puVar12;
    do {
      uVar8 = (ulong)*puVar5;
      if (*puVar5 < uVar11) {
        uVar8 = uVar11;
      }
      puVar5 = puVar5 + 1;
      uVar11 = uVar8;
    } while (puVar5 != puVar2);
    __n = uVar8 * 4 + 8;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__n,(allocator_type *)&local_48);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (normals,(((long)(normals->
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(normals->
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                     - ofs) + ((long)(this->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2));
  puVar5 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  if (puVar5 != puVar12) {
    do {
      uVar10 = (int)uVar11 + *puVar5;
      uVar11 = (ulong)uVar10;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar12);
    uVar11 = (ulong)(int)uVar10;
  }
  for (; puVar12 != puVar2; puVar12 = puVar12 + 1) {
    if (*puVar12 == 0) {
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      iVar3._M_current =
           (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)normals,iVar3,
                   &local_48);
      }
      else {
        (iVar3._M_current)->x = 0.0;
        (iVar3._M_current)->y = 0.0;
        (iVar3._M_current)->z = 0.0;
        ppaVar1 = &(normals->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
    else {
      if (*puVar12 != 0) {
        lVar6 = uVar11 * 0x18 + 0x10;
        lVar7 = 0;
        uVar8 = 0;
        do {
          paVar13 = (this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)
           ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar7) =
               *(undefined8 *)((long)paVar13 + lVar6 + -0x10);
          *(undefined8 *)
           ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar7 + 8) =
               *(undefined8 *)((long)paVar13 + lVar6 + -8);
          *(undefined8 *)
           ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar7 + 0x10) =
               *(undefined8 *)((long)&paVar13->x + lVar6);
          *(undefined8 *)
           ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar7 + 0x18) = 0x7ff8000000000000;
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x20;
          lVar6 = lVar6 + 0x18;
        } while (uVar8 < *puVar12);
      }
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      iVar3._M_current =
           (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)normals,iVar3,
                   &local_48);
      }
      else {
        (iVar3._M_current)->x = 0.0;
        (iVar3._M_current)->y = 0.0;
        (iVar3._M_current)->z = 0.0;
        ppaVar1 = &(normals->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      paVar13 = (normals->
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar10 = *puVar12;
      uVar8 = (ulong)(int)uVar10;
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8 * 4] =
           *local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      lVar6 = (long)(int)(uVar10 * 4 + 4);
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[4];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8 * 4 + 1] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + 1] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[5];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8 * 4 + 2] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + 2] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[6];
      if ((long)uVar8 < 1) {
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar14 = 0.0;
      }
      else {
        pdVar9 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 10;
        dVar14 = 0.0;
        dVar16 = 0.0;
        dVar15 = 0.0;
        do {
          dVar15 = dVar15 + (pdVar9[-1] - pdVar9[-9]) * pdVar9[-6];
          dVar16 = dVar16 + (*pdVar9 - pdVar9[-8]) * pdVar9[-5];
          dVar14 = dVar14 + (pdVar9[-2] - pdVar9[-10]) * pdVar9[-4];
          pdVar9 = pdVar9 + 4;
          uVar10 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      paVar13[-1].x = dVar16;
      paVar13[-1].y = dVar14;
      paVar13[-1].z = dVar15;
    }
    uVar11 = uVar11 + *puVar12;
  }
  if (normalize) {
    paVar4 = (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar13 = (normals->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar13 != paVar4;
        paVar13 = paVar13 + 1) {
      dVar14 = paVar13->z * paVar13->z + paVar13->x * paVar13->x + paVar13->y * paVar13->y;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      dVar14 = 1.0 / dVar14;
      paVar13->x = paVar13->x * dVar14;
      paVar13->y = paVar13->y * dVar14;
      paVar13->z = dVar14 * paVar13->z;
    }
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TempMesh::ComputePolygonNormals(std::vector<IfcVector3>& normals,
    bool normalize,
    size_t ofs) const
{
    size_t max_vcount = 0;
    std::vector<unsigned int>::const_iterator begin = mVertcnt.begin()+ofs, end = mVertcnt.end(),  iit;
    for(iit = begin; iit != end; ++iit) {
        max_vcount = std::max(max_vcount,static_cast<size_t>(*iit));
    }

    std::vector<IfcFloat> temp((max_vcount+2)*4);
    normals.reserve( normals.size() + mVertcnt.size()-ofs );

    // `NewellNormal()` currently has a relatively strange interface and need to
    // re-structure things a bit to meet them.
    size_t vidx = std::accumulate(mVertcnt.begin(),begin,0);
    for(iit = begin; iit != end; vidx += *iit++) {
        if (!*iit) {
            normals.push_back(IfcVector3());
            continue;
        }
        for(size_t vofs = 0, cnt = 0; vofs < *iit; ++vofs) {
            const IfcVector3& v = mVerts[vidx+vofs];
            temp[cnt++] = v.x;
            temp[cnt++] = v.y;
            temp[cnt++] = v.z;
#ifdef ASSIMP_BUILD_DEBUG
            temp[cnt] = std::numeric_limits<IfcFloat>::quiet_NaN();
#endif
            ++cnt;
        }

        normals.push_back(IfcVector3());
        NewellNormal<4,4,4>(normals.back(),*iit,&temp[0],&temp[1],&temp[2]);
    }

    if(normalize) {
        for(IfcVector3& n : normals) {
            n.Normalize();
        }
    }
}